

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_iostream.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *__lhs;
  int iVar1;
  long *plVar2;
  ostream *poVar3;
  runtime_error *prVar4;
  istream *piVar5;
  int i;
  long lVar6;
  int iVar7;
  uint uVar8;
  bool bVar9;
  string local_210 [32];
  string v1;
  string v2;
  ostringstream ss;
  
  iVar7 = 15000;
  while (bVar9 = iVar7 != 0, iVar7 = iVar7 + -1, bVar9) {
    plVar2 = (long *)std::istream::putback('\0');
    if ((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
      poVar3 = std::operator<<((ostream *)&ss,"Error nowide::cin.putback(c) in ");
      poVar3 = std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_iostream.cpp"
                              );
      poVar3 = std::operator<<(poVar3,':');
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x11);
      poVar3 = std::operator<<(poVar3," ");
      std::operator<<(poVar3,"main");
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar4,(string *)&v1);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  iVar7 = 14999;
  uVar8 = 15000;
  while (-1 < iVar7) {
    iVar1 = std::istream::get();
    iVar7 = iVar7 + -1;
    uVar8 = uVar8 - 1;
    if (iVar7 + (uVar8 / 0x60) * -0x60 + 0x21 != iVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
      poVar3 = std::operator<<((ostream *)&ss,"Error nowide::cin.get() == c in ");
      poVar3 = std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_iostream.cpp"
                              );
      poVar3 = std::operator<<(poVar3,':');
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x15);
      poVar3 = std::operator<<(poVar3," ");
      std::operator<<(poVar3,"main");
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar4,(string *)&v1);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  v1._M_dataplus._M_p = (pointer)&v1.field_2;
  v1._M_string_length = 0;
  v1.field_2._M_local_buf[0] = '\0';
  v2._M_dataplus._M_p = (pointer)&v2.field_2;
  v2._M_string_length = 0;
  v2.field_2._M_local_buf[0] = '\0';
  poVar3 = std::operator<<((ostream *)&std::cout,"Normal I/O:");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_22b4);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cerr,anon_var_dwarf_22b4);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Flushing each character:");
  std::endl<char,std::char_traits<char>>(poVar3);
  lVar6 = 0;
  while (lVar6 != 0x49) {
    std::operator<<((ostream *)&std::cout,anon_var_dwarf_22b4[lVar6]);
    std::ostream::flush();
    lVar6 = lVar6 + 1;
    if (((byte)std::runtime_error::runtime_error[*(long *)(std::cout + -0x18)] & 5) != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
      poVar3 = std::operator<<((ostream *)&ss,"Error nowide::cout in ");
      poVar3 = std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_iostream.cpp"
                              );
      poVar3 = std::operator<<(poVar3,':');
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x20);
      poVar3 = std::operator<<(poVar3," ");
      std::operator<<(poVar3,"main");
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar4,local_210);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  if (((byte)std::runtime_error::runtime_error[*(long *)(std::cout + -0x18)] & 5) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar3 = std::operator<<((ostream *)&ss,"Error nowide::cout in ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_iostream.cpp"
                            );
    poVar3 = std::operator<<(poVar3,':');
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x23);
    poVar3 = std::operator<<(poVar3," ");
    std::operator<<(poVar3,"main");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,local_210);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((*(byte *)(*(long *)(std::cerr + -0x18) + 0x106148) & 5) == 0) {
    if (argc == 2) {
      __lhs = argv[1];
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ss,"-i",(allocator<char> *)local_210);
      bVar9 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&ss);
      std::__cxx11::string::~string((string *)&ss);
      if (bVar9) {
        piVar5 = std::operator>>((istream *)&std::cin,(string *)&v1);
        std::operator>>(piVar5,(string *)&v2);
        if (((byte)_ITM_registerTMCloneTable[*(long *)(std::cin + -0x18)] & 5) != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
          poVar3 = std::operator<<((ostream *)&ss,"Error nowide::cin in ");
          poVar3 = std::operator<<(poVar3,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_iostream.cpp"
                                  );
          poVar3 = std::operator<<(poVar3,':');
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x27);
          poVar3 = std::operator<<(poVar3," ");
          std::operator<<(poVar3,"main");
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar4,local_210);
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        poVar3 = std::operator<<((ostream *)&std::cout,"First:  ");
        poVar3 = std::operator<<(poVar3,(string *)&v1);
        std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::operator<<((ostream *)&std::cout,"Second: ");
        poVar3 = std::operator<<(poVar3,(string *)&v2);
        std::endl<char,std::char_traits<char>>(poVar3);
        if (((byte)std::runtime_error::runtime_error[*(long *)(std::cout + -0x18)] & 5) != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
          poVar3 = std::operator<<((ostream *)&ss,"Error nowide::cout in ");
          poVar3 = std::operator<<(poVar3,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_iostream.cpp"
                                  );
          poVar3 = std::operator<<(poVar3,':');
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x2a);
          poVar3 = std::operator<<(poVar3," ");
          std::operator<<(poVar3,"main");
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar4,local_210);
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
    }
    std::__cxx11::string::~string((string *)&v2);
    std::__cxx11::string::~string((string *)&v1);
    poVar3 = std::operator<<((ostream *)&std::cout,"Ok");
    std::endl<char,std::char_traits<char>>(poVar3);
    return 0;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  poVar3 = std::operator<<((ostream *)&ss,"Error nowide::cerr in ");
  poVar3 = std::operator<<(poVar3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_iostream.cpp"
                          );
  poVar3 = std::operator<<(poVar3,':');
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x24);
  poVar3 = std::operator<<(poVar3," ");
  std::operator<<(poVar3,"main");
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar4,local_210);
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main(int argc,char **argv)
{
    
    char const *example = "Basic letters: \xd7\xa9-\xd0\xbc-\xce\xbd\n"
                          "East Asian Letters: \xe5\x92\x8c\xe5\xb9\xb3\n"
                          "Non-BMP letters: \xf0\x9d\x84\x9e\n";

    try {
        int maxval = 15000;
        for(int i=0;i<maxval;i++) {
            char c = i % 96 + ' ';
            TEST(nowide::cin.putback(c));
        }
        for(int i=maxval-1;i>=0;i--) {
            int c = i % 96 + ' ';
            TEST(nowide::cin.get() == c);
        }
        std::string v1,v2;
        nowide::cout << "Normal I/O:" << std::endl;
        nowide::cout << example << std::endl;
        nowide::cerr << example << std::endl;
        
        nowide::cout << "Flushing each character:" << std::endl;
        
        for(char const *s=example;*s;s++) {
            nowide::cout << *s << std::flush;
            TEST(nowide::cout);
        }
        
        TEST(nowide::cout);
        TEST(nowide::cerr);
        if(argc==2 && argv[1]==std::string("-i")) {
            nowide::cin  >> v1 >> v2;
            TEST(nowide::cin);
            nowide::cout << "First:  "<< v1 << std::endl;
            nowide::cout << "Second: "<< v2 << std::endl;
            TEST(nowide::cout);
        }
    }
    catch(std::exception const &e) {
        std::cerr << "Fail: " << e.what() << std::endl;
        return 1;
    }
    std::cout <<"Ok" << std::endl;
    return 0;

}